

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDH.cpp
# Opt level: O0

bool __thiscall
OSSLECDH::deriveKey(OSSLECDH *this,SymmetricKey **ppSymmetricKey,PublicKey *publicKey,
                   PrivateKey *privateKey)

{
  EC_KEY *pEVar1;
  EC_KEY *pEVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  EC_POINT *pEVar6;
  undefined8 uVar7;
  uchar *puVar8;
  size_t sVar9;
  ulong uVar10;
  uchar *__src;
  SymmetricKey *this_00;
  OSSLECPrivateKey *in_RCX;
  OSSLECPublicKey *in_RDX;
  long *in_RSI;
  int keySize;
  int size;
  ByteString derivedSecret;
  ByteString secret;
  EC_KEY *priv;
  EC_KEY *pub;
  size_t in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  size_t in_stack_fffffffffffffef8;
  ByteString *in_stack_ffffffffffffff00;
  undefined1 local_60 [40];
  EC_KEY *local_38;
  EC_KEY *local_30;
  OSSLECPrivateKey *local_28;
  OSSLECPublicKey *local_20;
  long *local_18;
  byte local_1;
  
  if (((in_RSI == (long *)0x0) || (in_RDX == (OSSLECPublicKey *)0x0)) ||
     (in_RCX == (OSSLECPrivateKey *)0x0)) {
    local_1 = 0;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_30 = (EC_KEY *)OSSLECPublicKey::getOSSLKey(in_RDX);
    local_38 = OSSLECPrivateKey::getOSSLKey(local_28);
    if (local_30 != (EC_KEY *)0x0) {
      pEVar6 = EC_KEY_get0_public_key(local_30);
      pEVar2 = local_30;
      if ((pEVar6 != (EC_POINT *)0x0) && (local_38 != (EC_KEY *)0x0)) {
        uVar7 = EC_KEY_OpenSSL();
        EC_KEY_set_method(pEVar2,uVar7);
        pEVar1 = local_38;
        uVar7 = EC_KEY_OpenSSL();
        EC_KEY_set_method(pEVar1,uVar7);
        ByteString::ByteString((ByteString *)0x12ad26);
        ByteString::ByteString((ByteString *)0x12ad33);
        iVar4 = (*(local_20->super_ECPublicKey).super_PublicKey.super_Serialisable.
                  _vptr_Serialisable[6])();
        ByteString::wipe(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        ByteString::wipe(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        puVar8 = ByteString::operator[]
                           ((ByteString *)
                            CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffee8);
        sVar9 = ByteString::size((ByteString *)0x12adac);
        pEVar6 = EC_KEY_get0_public_key(local_30);
        iVar5 = ECDH_compute_key(puVar8,sVar9,pEVar6,(EC_KEY *)local_38,(KDF *)0x0);
        if (iVar5 < 1) {
          uVar10 = ERR_get_error();
          softHSMLog(3,"deriveKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDH.cpp"
                     ,0xde,"ECDH key derivation failed (0x%08X)",uVar10);
          local_1 = 0;
        }
        else {
          puVar8 = ByteString::operator[]
                             ((ByteString *)
                              CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8);
          __src = ByteString::operator[]
                            ((ByteString *)
                             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffee8);
          memcpy(puVar8 + ((long)iVar4 - (long)iVar5),__src,(long)iVar5);
          this_00 = (SymmetricKey *)operator_new(0x38);
          sVar9 = ByteString::size((ByteString *)0x12af00);
          SymmetricKey::SymmetricKey(this_00,sVar9);
          *local_18 = (long)this_00;
          if (*local_18 == 0) {
            local_1 = 0;
          }
          else {
            bVar3 = (**(code **)(*(long *)*local_18 + 0x18))((long *)*local_18,local_60);
            if ((bVar3 & 1) == 0) {
              if ((long *)*local_18 != (long *)0x0) {
                (**(code **)(*(long *)*local_18 + 0x10))();
              }
              *local_18 = 0;
              local_1 = 0;
            }
            else {
              local_1 = 1;
            }
          }
        }
        ByteString::~ByteString((ByteString *)0x12affb);
        ByteString::~ByteString((ByteString *)0x12b008);
        goto LAB_0012b026;
      }
    }
    softHSMLog(3,"deriveKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDH.cpp"
               ,0xb8,"Failed to get OpenSSL ECDH keys");
    local_1 = 0;
  }
LAB_0012b026:
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLECDH::deriveKey(SymmetricKey **ppSymmetricKey, PublicKey* publicKey, PrivateKey* privateKey)
{
	// Check parameters
	if ((ppSymmetricKey == NULL) ||
	    (publicKey == NULL) ||
	    (privateKey == NULL))
	{
		return false;
	}

	// Get keys
	EC_KEY *pub = ((OSSLECPublicKey *)publicKey)->getOSSLKey();
	EC_KEY *priv = ((OSSLECPrivateKey *)privateKey)->getOSSLKey();
	if (pub == NULL || EC_KEY_get0_public_key(pub) == NULL || priv == NULL)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH keys");

		return false;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
	{
		ECDH_set_method(pub, FIPS_ecdh_openssl());
		ECDH_set_method(priv, FIPS_ecdh_openssl());
	}
	else
	{
		ECDH_set_method(pub, ECDH_OpenSSL());
		ECDH_set_method(priv, ECDH_OpenSSL());
	}
#else
	ECDH_set_method(pub, ECDH_OpenSSL());
	ECDH_set_method(priv, ECDH_OpenSSL());
#endif

#else
	EC_KEY_set_method(pub, EC_KEY_OpenSSL());
	EC_KEY_set_method(priv, EC_KEY_OpenSSL());
#endif

	// Derive the secret
	ByteString secret, derivedSecret;
	int size = ((OSSLECPublicKey *)publicKey)->getOrderLength();
	secret.wipe(size);
	derivedSecret.wipe(size);
	int keySize = ECDH_compute_key(&derivedSecret[0], derivedSecret.size(), EC_KEY_get0_public_key(pub), priv, NULL);

	if (keySize <= 0)
	{
		ERROR_MSG("ECDH key derivation failed (0x%08X)", ERR_get_error());

		return false;
	}

	// We compensate that OpenSSL removes leading zeros
	memcpy(&secret[0] + size - keySize, &derivedSecret[0], keySize);

	*ppSymmetricKey = new SymmetricKey(secret.size() * 8);
	if (*ppSymmetricKey == NULL)
		return false;
	if (!(*ppSymmetricKey)->setKeyBits(secret))
	{
		delete *ppSymmetricKey;
		*ppSymmetricKey = NULL;
		return false;
	}

	return true;
}